

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O3

void Executor::declareStmt(treeNode *node)

{
  treeNode *node_00;
  pointer pcVar1;
  string local_38;
  
  node_00 = node->child[1];
  pcVar1 = (node->child[0]->text)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (node->child[0]->text)._M_string_length);
  declareSequence(node_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void declareStmt(treeNode* node)
    {
        declareSequence(node->child[1], node->child[0]->text);
    }